

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::pushChoice
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Index choice)

{
  value_type_conflict2 local_14 [2];
  Index choice_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->choiceHeap,local_14);
  std::
  push_heap<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::pushChoice(unsigned_int)::_lambda(unsigned_int,unsigned_int)_1_>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_8991fb9c_for__M_comp)this);
  return;
}

Assistant:

void pushChoice(Index choice) {
    choiceHeap.push_back(choice);
    std::push_heap(choiceHeap.begin(), choiceHeap.end(), [&](Index a, Index b) {
      return cmp(b, a);
    });
  }